

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O1

__pid_t __thiscall CSemaphore::wait(CSemaphore *this,void *__stat_loc)

{
  int iVar1;
  long in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &this->mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = this->value;
  while (iVar1 < 1) {
    std::condition_variable::wait((unique_lock *)this);
    iVar1 = this->value;
  }
  this->value = this->value + -1;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (__pid_t)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void wait() noexcept
    {
        std::unique_lock<std::mutex> lock(mutex);
        condition.wait(lock, [&]() { return value >= 1; });
        value--;
    }